

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_CompileMessageList.cpp
# Opt level: O0

string * __thiscall
soul::CompileMessage::getPositionString_abi_cxx11_
          (string *__return_storage_ptr__,CompileMessage *this)

{
  bool bVar1;
  string local_98;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  LineAndColumn local_34;
  LineAndColumn lc;
  allocator<char> local_19;
  CompileMessage *local_18;
  CompileMessage *this_local;
  
  local_18 = this;
  this_local = (CompileMessage *)__return_storage_ptr__;
  bVar1 = hasPosition(this);
  if (bVar1) {
    local_34 = CodeLocation::getLineAndColumn(&this->location);
    std::__cxx11::to_string(&local_78,local_34.line);
    std::operator+(&local_58,&local_78,":");
    std::__cxx11::to_string(&local_98,local_34.column);
    std::operator+(__return_storage_ptr__,&local_58,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"0:0",&local_19);
    std::allocator<char>::~allocator(&local_19);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CompileMessage::getPositionString() const
{
    if (! hasPosition())
        return "0:0";

    auto lc = location.getLineAndColumn();
    return std::to_string (lc.line) + ":" + std::to_string (lc.column);
}